

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O1

void __thiscall
leveldb::FilterBlockBuilder::StartBlock(FilterBlockBuilder *this,uint64_t block_offset)

{
  if (block_offset >> 0xb <
      (ulong)((long)(this->filter_offsets_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->filter_offsets_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    __assert_fail("filter_index >= filter_offsets_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block.cc"
                  ,0x17,"void leveldb::FilterBlockBuilder::StartBlock(uint64_t)");
  }
  while ((ulong)((long)(this->filter_offsets_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->filter_offsets_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) < block_offset >> 0xb) {
    GenerateFilter(this);
  }
  return;
}

Assistant:

void FilterBlockBuilder::StartBlock(uint64_t block_offset) {
  uint64_t filter_index = (block_offset / kFilterBase);
  assert(filter_index >= filter_offsets_.size());
  while (filter_index > filter_offsets_.size()) {
    GenerateFilter();
  }
}